

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManReadRange(Prs_Man_t *p)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  int iVar4;
  int iData1;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  uint Value;
  ulong extraout_RDX_00;
  char *pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ulong extraout_RDX;
  
  if (*p->pCur != '[') {
    __assert_fail("Prs_ManIsChar(p, \'[\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                  ,0x20b,"int Prs_ManReadRange(Prs_Man_t *)");
  }
  pbVar6 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar6;
  pbVar3 = (byte *)p->pLimit;
  while( true ) {
    if (pbVar3 <= pbVar6) goto LAB_00347875;
    while( true ) {
      uVar7 = (ulong)*pbVar6;
      if (0x2f < uVar7) goto LAB_003478c4;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
    }
    if (uVar7 != 0x2f) break;
    if (pbVar6[1] != 0x2a) {
      if (pbVar6[1] == 0x2f) {
        pbVar6 = pbVar6 + 2;
        p->pCur = (char *)pbVar6;
        if (pbVar6 < pbVar3) {
          while (*pbVar6 != 10) {
            pbVar6 = pbVar6 + 1;
            p->pCur = (char *)pbVar6;
            if (pbVar6 == pbVar3) goto LAB_003478c4;
          }
          pbVar6 = pbVar6 + 1;
          goto LAB_00347861;
        }
      }
      goto LAB_003478c4;
    }
    pbVar6 = pbVar6 + 2;
    p->pCur = (char *)pbVar6;
    if (pbVar3 <= pbVar6) goto LAB_003478c4;
    while ((*pbVar6 != 0x2a || (pbVar6[1] != 0x2f))) {
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
      if (pbVar6 == pbVar3) goto LAB_003478c4;
    }
    pbVar6 = pbVar6 + 2;
LAB_00347861:
    p->pCur = (char *)pbVar6;
  }
  if (uVar7 == 0) goto LAB_00347875;
LAB_003478c4:
  if ((byte)(*p->pCur - 0x3aU) < 0xf6) {
    if (p->ErrorStr[0] != '\0') goto LAB_00347ca4;
    builtin_strncpy(p->ErrorStr + 0x10,"t in range specification.",0x1a);
    uVar9._0_1_ = 'C';
    uVar9._1_1_ = 'a';
    uVar9._2_1_ = 'n';
    uVar9._3_1_ = 'n';
    uVar10._0_1_ = 'o';
    uVar10._1_1_ = 't';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'r';
    uVar11._0_1_ = 'e';
    uVar11._1_1_ = 'a';
    uVar11._2_1_ = 'd';
    uVar11._3_1_ = ' ';
    uVar12._0_1_ = 'd';
    uVar12._1_1_ = 'i';
    uVar12._2_1_ = 'g';
    uVar12._3_1_ = 'i';
    goto LAB_00347a24;
  }
  iVar4 = atoi(p->pCur);
  Value = (uint)extraout_RDX;
  pbVar6 = (byte *)p->pCur;
  bVar1 = *pbVar6;
  while (0xf5 < (byte)(bVar1 - 0x3a)) {
    pbVar6 = pbVar6 + 1;
    p->pCur = (char *)pbVar6;
    bVar1 = *pbVar6;
  }
  do {
    if (pbVar3 <= pbVar6) {
LAB_003479da:
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_00347ca4;
        uVar9._0_1_ = 'E';
        uVar9._1_1_ = 'r';
        uVar9._2_1_ = 'r';
        uVar9._3_1_ = 'o';
        uVar10._0_1_ = 'r';
        uVar10._1_1_ = ' ';
        uVar10._2_1_ = 'n';
        uVar10._3_1_ = 'u';
        uVar11._0_1_ = 'm';
        uVar11._1_1_ = 'b';
        uVar11._2_1_ = 'e';
        uVar11._3_1_ = 'r';
        uVar12._0_1_ = ' ';
        uVar12._1_1_ = '4';
        uVar12._2_1_ = '.';
        uVar12._3_1_ = '\0';
        goto LAB_00347a24;
      }
      goto LAB_00347ca4;
    }
    while( true ) {
      uVar7 = (ulong)*pbVar6;
      if (0x2f < uVar7) goto LAB_00347a37;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
    }
    if (uVar7 != 0x2f) {
      if (uVar7 == 0) goto LAB_003479da;
LAB_00347a37:
      pbVar6 = (byte *)p->pCur;
      uVar7 = extraout_RDX;
      iData1 = iVar4;
      if (*pbVar6 != 0x3a) goto LAB_00347b2b;
      break;
    }
    if (pbVar6[1] != 0x2a) {
      if (pbVar6[1] == 0x2f) {
        pbVar6 = pbVar6 + 2;
        p->pCur = (char *)pbVar6;
        if (pbVar6 < pbVar3) {
          while (*pbVar6 != 10) {
            pbVar6 = pbVar6 + 1;
            p->pCur = (char *)pbVar6;
            if (pbVar6 == pbVar3) goto LAB_00347a37;
          }
          pbVar6 = pbVar6 + 1;
          goto LAB_003479cd;
        }
      }
      goto LAB_00347a37;
    }
    pbVar6 = pbVar6 + 2;
    p->pCur = (char *)pbVar6;
    if (pbVar3 <= pbVar6) goto LAB_00347a37;
    while ((*pbVar6 != 0x2a || (pbVar6[1] != 0x2f))) {
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
      if (pbVar6 == pbVar3) goto LAB_00347a37;
    }
    pbVar6 = pbVar6 + 2;
LAB_003479cd:
    p->pCur = (char *)pbVar6;
  } while( true );
LAB_00347a47:
  pbVar6 = pbVar6 + 1;
  do {
    p->pCur = (char *)pbVar6;
    if (pbVar3 <= pbVar6) {
LAB_00347bff:
      if (p->ErrorStr[0] != '\0') goto LAB_00347ca4;
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] != '\0') goto LAB_00347ca4;
      uVar9._0_1_ = 'E';
      uVar9._1_1_ = 'r';
      uVar9._2_1_ = 'r';
      uVar9._3_1_ = 'o';
      uVar10._0_1_ = 'r';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'u';
      uVar11._0_1_ = 'm';
      uVar11._1_1_ = 'b';
      uVar11._2_1_ = 'e';
      uVar11._3_1_ = 'r';
      uVar12._0_1_ = ' ';
      uVar12._1_1_ = '5';
      uVar12._2_1_ = '.';
      uVar12._3_1_ = '\0';
      goto LAB_00347a24;
    }
    while( true ) {
      uVar7 = (ulong)*pbVar6;
      if (0x2f < uVar7) goto LAB_00347ad1;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
    }
    if (uVar7 != 0x2f) {
      if (uVar7 == 0) goto LAB_00347bff;
      goto LAB_00347ad1;
    }
    if (pbVar6[1] != 0x2a) break;
    pbVar6 = pbVar6 + 2;
    p->pCur = (char *)pbVar6;
    if (pbVar3 <= pbVar6) goto LAB_00347ad1;
    while ((*pbVar6 != 0x2a || (pbVar6[1] != 0x2f))) {
      pbVar6 = pbVar6 + 1;
      p->pCur = (char *)pbVar6;
      if (pbVar6 == pbVar3) goto LAB_00347ad1;
    }
    pbVar6 = pbVar6 + 2;
  } while( true );
  if (pbVar6[1] != 0x2f) goto LAB_00347ad1;
  pbVar6 = pbVar6 + 2;
  p->pCur = (char *)pbVar6;
  if (pbVar3 <= pbVar6) goto LAB_00347ad1;
  while (*pbVar6 != 10) {
    pbVar6 = pbVar6 + 1;
    p->pCur = (char *)pbVar6;
    if (pbVar6 == pbVar3) goto LAB_00347ad1;
  }
  goto LAB_00347a47;
LAB_00347875:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar9._0_1_ = 'E';
      uVar9._1_1_ = 'r';
      uVar9._2_1_ = 'r';
      uVar9._3_1_ = 'o';
      uVar10._0_1_ = 'r';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'n';
      uVar10._3_1_ = 'u';
      uVar11._0_1_ = 'm';
      uVar11._1_1_ = 'b';
      uVar11._2_1_ = 'e';
      uVar11._3_1_ = 'r';
      uVar12._0_1_ = ' ';
      uVar12._1_1_ = '3';
      uVar12._2_1_ = '.';
      uVar12._3_1_ = '\0';
LAB_00347a24:
      *(undefined4 *)p->ErrorStr = uVar9;
      *(undefined4 *)(p->ErrorStr + 4) = uVar10;
      *(undefined4 *)(p->ErrorStr + 8) = uVar11;
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar12;
      return 0;
    }
  }
LAB_00347ca4:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
LAB_00347ad1:
  if ((byte)(*p->pCur - 0x3aU) < 0xf6) {
    pcVar8 = "Cannot read digit in range specification.";
  }
  else {
    iData1 = atoi(p->pCur);
    pcVar8 = p->pCur;
    cVar2 = *pcVar8;
    while (0xf5 < (byte)(cVar2 - 0x3aU)) {
      pcVar8 = pcVar8 + 1;
      p->pCur = pcVar8;
      cVar2 = *pcVar8;
    }
    iVar5 = Prs_ManUtilSkipSpaces(p);
    Value = (uint)extraout_RDX_00;
    uVar7 = extraout_RDX_00;
    if (iVar5 == 0) {
LAB_00347b2b:
      Value = (uint)uVar7;
      if (*p->pCur == ']') {
        pbVar6 = (byte *)(p->pCur + 1);
        p->pCur = (char *)pbVar6;
        pbVar3 = (byte *)p->pLimit;
        while (Value = (uint)uVar7, pbVar6 < pbVar3) {
          while( true ) {
            uVar7 = (ulong)*pbVar6;
            Value = (uint)*pbVar6;
            if (0x2f < uVar7) goto LAB_00347c8e;
            if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
            pbVar6 = pbVar6 + 1;
            p->pCur = (char *)pbVar6;
          }
          if (uVar7 != 0x2f) {
            if (uVar7 != 0) goto LAB_00347c8e;
            break;
          }
          bVar1 = pbVar6[1];
          uVar7 = (ulong)bVar1;
          if (bVar1 == 0x2a) {
            pbVar6 = pbVar6 + 2;
            p->pCur = (char *)pbVar6;
            if (pbVar3 <= pbVar6) goto LAB_00347c8e;
            while ((*pbVar6 != 0x2a || (pbVar6[1] != 0x2f))) {
              pbVar6 = pbVar6 + 1;
              p->pCur = (char *)pbVar6;
              if (pbVar6 == pbVar3) goto LAB_00347c8e;
            }
            pbVar6 = pbVar6 + 2;
          }
          else {
            if (bVar1 != 0x2f) {
LAB_00347c8e:
              iVar4 = Hash_Int2ManInsert(p->vHash,iVar4,iData1,(int)pbVar3);
              return iVar4;
            }
            pbVar6 = pbVar6 + 2;
            p->pCur = (char *)pbVar6;
            if (pbVar3 <= pbVar6) goto LAB_00347c8e;
            while (*pbVar6 != 10) {
              pbVar6 = pbVar6 + 1;
              p->pCur = (char *)pbVar6;
              if (pbVar6 == pbVar3) goto LAB_00347c8e;
            }
            pbVar6 = pbVar6 + 1;
          }
          p->pCur = (char *)pbVar6;
        }
        if (p->ErrorStr[0] != '\0') goto LAB_00347ca4;
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        pcVar8 = "Error number 6a.";
      }
      else {
        pcVar8 = "Cannot read closing brace in range specification.";
      }
    }
    else {
      pcVar8 = "Error number 6.";
    }
  }
  Prs_ManErrorSet(p,pcVar8,Value);
  return 0;
}

Assistant:

static inline int Prs_ManReadRange( Prs_Man_t * p )
{
    int Left, Right;
    assert( Prs_ManIsChar(p, '[') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 3.", 0);
    if ( !Prs_ManIsDigit(p) )               return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
    Left = Right = atoi(p->pCur);
    while ( Prs_ManIsDigit(p) ) 
        p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 4.", 0);
    if ( Prs_ManIsChar(p, ':') )
    {
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 5.", 0);
        if ( !Prs_ManIsDigit(p) )           return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
        Right = atoi(p->pCur);
        while ( Prs_ManIsDigit(p) ) 
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 6.", 0);
    }
    if ( !Prs_ManIsChar(p, ']') )           return Prs_ManErrorSet(p, "Cannot read closing brace in range specification.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 6a.", 0);
    return Hash_Int2ManInsert( p->vHash, Left, Right, 0 );
}